

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::DateFormatSymbols::getWeekdays
          (DateFormatSymbols *this,int32_t *count,DtContextType context,DtWidthType width)

{
  long lVar1;
  undefined *puVar2;
  undefined *puVar3;
  
  if (context == STANDALONE) {
    if (SHORT < width) {
      return (UnicodeString *)0x0;
    }
    puVar2 = &DAT_003a9ef8;
    puVar3 = &DAT_003a9ed8;
  }
  else {
    if ((context != FORMAT) || (SHORT < width)) {
      return (UnicodeString *)0x0;
    }
    puVar2 = &DAT_003a9eb8;
    puVar3 = &DAT_003a9e98;
  }
  lVar1 = *(long *)(puVar2 + (long)(int)width * 8);
  *count = *(int32_t *)
            ((long)&(this->super_UObject)._vptr_UObject + *(long *)(puVar3 + (long)(int)width * 8));
  return *(UnicodeString **)((long)&(this->super_UObject)._vptr_UObject + lVar1);
}

Assistant:

const UnicodeString*
DateFormatSymbols::getWeekdays(int32_t &count, DtContextType context, DtWidthType width) const
{
    UnicodeString *returnValue = NULL;
    switch (context) {
    case FORMAT :
        switch(width) {
            case WIDE :
                count = fWeekdaysCount;
                returnValue = fWeekdays;
                break;
            case ABBREVIATED :
                count = fShortWeekdaysCount;
                returnValue = fShortWeekdays;
                break;
            case SHORT :
                count = fShorterWeekdaysCount;
                returnValue = fShorterWeekdays;
                break;
            case NARROW :
                count = fNarrowWeekdaysCount;
                returnValue = fNarrowWeekdays;
                break;
            case DT_WIDTH_COUNT :
                break;
        }
        break;
    case STANDALONE :
        switch(width) {
            case WIDE :
                count = fStandaloneWeekdaysCount;
                returnValue = fStandaloneWeekdays;
                break;
            case ABBREVIATED :
                count = fStandaloneShortWeekdaysCount;
                returnValue = fStandaloneShortWeekdays;
                break;
            case SHORT :
                count = fStandaloneShorterWeekdaysCount;
                returnValue = fStandaloneShorterWeekdays;
                break;
            case NARROW :
                count = fStandaloneNarrowWeekdaysCount;
                returnValue = fStandaloneNarrowWeekdays;
                break;
            case DT_WIDTH_COUNT :
                break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
    return returnValue;
}